

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O3

char p_b_coll_elem(parse *p,int endc)

{
  char *__s2;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  cname *pcVar4;
  char *pcVar5;
  int iVar6;
  long lVar7;
  
  __s2 = p->next;
  pcVar5 = p->end;
  if (__s2 < pcVar5) {
    lVar7 = 0;
    iVar6 = 0;
    pcVar2 = __s2;
    do {
      pcVar3 = pcVar2 + 1;
      if (((pcVar3 < pcVar5) && (*pcVar2 == endc)) && (*pcVar3 == ']')) {
        pcVar5 = "NUL";
        pcVar4 = cnames;
        do {
          pcVar4 = pcVar4 + 1;
          iVar1 = strncmp(pcVar5,__s2,lVar7 >> 0x20);
          if ((iVar1 == 0) && (pcVar5[lVar7 >> 0x20] == '\0')) {
            return pcVar4[-1].code;
          }
          pcVar5 = pcVar4->name;
        } while (pcVar5 != (char *)0x0);
        if (iVar6 == -1) {
          return *__s2;
        }
        if (p->error == 0) {
          p->error = 3;
        }
        goto LAB_00106d13;
      }
      p->next = pcVar3;
      iVar6 = iVar6 + -1;
      lVar7 = lVar7 + 0x100000000;
      pcVar2 = pcVar3;
    } while (pcVar3 != pcVar5);
  }
  if (p->error == 0) {
    p->error = 7;
  }
LAB_00106d13:
  p->next = nuls;
  p->end = nuls;
  return '\0';
}

Assistant:

static char			/* value of collating element */
p_b_coll_elem(p, endc)
register struct parse *p;
int endc;			/* name ended by endc,']' */
{
	register char *sp = p->next;
	register struct cname *cp;
	register int len;

	while (MORE() && !SEETWO(endc, ']'))
		NEXT();
	if (!MORE()) {
		SETERROR(REG_EBRACK);
		return(0);
	}
	len = (int) (p->next - sp);
	for (cp = cnames; cp->name != NULL; cp++)
		if (strncmp(cp->name, sp, len) == 0 && cp->name[len] == '\0')
			return(cp->code);	/* known name */
	if (len == 1)
		return(*sp);	/* single character */
	SETERROR(REG_ECOLLATE);			/* neither */
	return(0);
}